

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

int gdImageColorReplaceThreshold(gdImagePtr im,int src,int dst,float threshold)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  
  iVar4 = 0;
  if (src != dst) {
    iVar6 = im->cy1;
    iVar4 = 0;
    if (im->trueColor == 0) {
      if (iVar6 <= im->cy2) {
        iVar4 = 0;
        lVar5 = (long)iVar6;
        do {
          iVar6 = im->cx1;
          if (iVar6 <= im->cx2) {
            lVar3 = (long)iVar6 + -1;
            do {
              iVar2 = gdColorMatch(im,src,(uint)im->pixels[lVar5][lVar3 + 1],threshold);
              if (iVar2 != 0) {
                gdImageSetPixel(im,iVar6,(int)lVar5,dst);
                iVar4 = iVar4 + 1;
              }
              lVar3 = lVar3 + 1;
              iVar6 = iVar6 + 1;
            } while (lVar3 < im->cx2);
          }
          bVar1 = lVar5 < im->cy2;
          lVar5 = lVar5 + 1;
        } while (bVar1);
      }
    }
    else if (iVar6 <= im->cy2) {
      iVar4 = 0;
      lVar5 = (long)iVar6;
      do {
        iVar6 = im->cx1;
        if (iVar6 <= im->cx2) {
          lVar3 = (long)iVar6 + -1;
          do {
            iVar2 = gdColorMatch(im,src,im->tpixels[lVar5][lVar3 + 1],threshold);
            if (iVar2 != 0) {
              gdImageSetPixel(im,iVar6,(int)lVar5,dst);
              iVar4 = iVar4 + 1;
            }
            lVar3 = lVar3 + 1;
            iVar6 = iVar6 + 1;
          } while (lVar3 < im->cx2);
        }
        bVar1 = lVar5 < im->cy2;
        lVar5 = lVar5 + 1;
      } while (bVar1);
    }
  }
  return iVar4;
}

Assistant:

BGD_DECLARE(int) gdImageColorReplaceThreshold (gdImagePtr im, int src, int dst, float threshold)
{
	register int x, y;
	int n = 0;

	if (src == dst) {
		return 0;
	}

#define REPLACING_LOOP(pixel) do {										\
		for (y = im->cy1; y <= im->cy2; y++) {							\
			for (x = im->cx1; x <= im->cx2; x++) {						\
				if (gdColorMatch(im, src, pixel(im, x, y), threshold)) { \
					gdImageSetPixel(im, x, y, dst);						\
					n++;												\
				}														\
			}															\
		}																\
	} while (0)

	if (im->trueColor) {
		REPLACING_LOOP(gdImageTrueColorPixel);
	} else {
		REPLACING_LOOP(gdImagePalettePixel);
	}

#undef REPLACING_LOOP

	return n;
}